

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS
ref_metric_faceid_spacing
          (REF_DBL *metric,REF_GRID ref_grid,REF_INT faceid,REF_DBL set_normal_spacing,
          REF_DBL ceil_normal_spacing,REF_DBL tangential_aspect_ratio)

{
  int iVar1;
  REF_NODE ref_node;
  REF_STATUS RVar2;
  uint uVar3;
  REF_INT *vector;
  ulong uVar4;
  REF_DBL *vector_00;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  undefined8 uVar8;
  int iVar9;
  REF_CELL ref_cell;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  char *pcVar14;
  REF_DBL *pRVar15;
  REF_EDGE pRVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double local_258 [6];
  double local_228 [3];
  double local_210;
  double dStack_208;
  double local_200;
  REF_DBL *local_1f8;
  REF_CELL local_1f0;
  REF_DBL local_1e8;
  REF_DBL local_1e0;
  REF_DBL local_1d8;
  REF_GRID local_1d0;
  double local_1c8;
  REF_INT *local_1c0;
  double local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  REF_DBL normal [3];
  double adStack_180 [3];
  REF_EDGE ref_edge;
  double local_150 [9];
  REF_INT nodes [27];
  REF_DBL logm [6];
  REF_DBL m [6];
  
  ref_node = ref_grid->node;
  uVar5 = (ulong)(uint)ref_node->max;
  local_1e8 = tangential_aspect_ratio;
  local_1e0 = set_normal_spacing;
  local_1d8 = ceil_normal_spacing;
  if (ref_node->max < 0) {
    pcVar14 = "malloc hits of REF_INT negative";
    uVar8 = 0x92c;
LAB_0017deee:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar8,
           "ref_metric_faceid_spacing",pcVar14);
    RVar2 = 1;
  }
  else {
    local_1f0 = ref_grid->cell[3];
    vector = (REF_INT *)malloc(uVar5 * 4);
    if (vector == (REF_INT *)0x0) {
      pcVar14 = "malloc hits of REF_INT NULL";
      uVar8 = 0x92c;
    }
    else {
      for (uVar4 = 0; uVar4 < uVar5; uVar4 = uVar4 + 1) {
        vector[uVar4] = 0;
      }
      vector_00 = (REF_DBL *)malloc(uVar5 * 0x30);
      if (vector_00 != (REF_DBL *)0x0) {
        for (uVar4 = 0; (uVar5 * 6 & 0xffffffff) != uVar4; uVar4 = uVar4 + 1) {
          vector_00[uVar4] = 0.0;
        }
        adStack_180[1] = local_1e0 * 1e+20 * local_1e0;
        if (adStack_180[1] <= -adStack_180[1]) {
          adStack_180[1] = -adStack_180[1];
        }
        adStack_180[2] = 0.0;
        local_1b8 = 1.0 / (local_1e0 * local_1e0);
        ref_cell = local_1f0;
        local_1d0 = ref_grid;
        for (iVar12 = 0; iVar12 < ref_cell->max; iVar12 = iVar12 + 1) {
          RVar2 = ref_cell_nodes(ref_cell,iVar12,nodes);
          if ((RVar2 == 0) && (nodes[ref_cell->node_per] == faceid)) {
            local_1c0 = vector;
            uVar3 = ref_node_tri_normal(ref_node,nodes,normal);
            if (uVar3 != 0) {
              uVar5 = (ulong)uVar3;
              pcVar14 = "normal area";
              uVar8 = 0x932;
              goto LAB_0017e837;
            }
            uVar3 = ref_math_normalize(normal);
            vector = local_1c0;
            if (uVar3 != 0) {
              uVar5 = (ulong)uVar3;
              pcVar14 = "normalize";
              uVar8 = 0x933;
              goto LAB_0017e837;
            }
            lVar6 = 0;
            local_1f8 = metric;
            while (lVar6 < ref_cell->node_per) {
              lVar10 = (long)nodes[lVar6];
              local_1a8 = lVar10 * 6;
              pRVar15 = metric + lVar10 * 6;
              local_1a0 = lVar6;
              uVar3 = ref_matrix_diag_m(pRVar15,(REF_DBL *)&ref_edge);
              if (uVar3 != 0) {
                uVar5 = (ulong)uVar3;
                pcVar14 = "decomp";
                uVar8 = 0x8e8;
                goto LAB_0017e80c;
              }
              pdVar7 = local_150 + 2;
              dVar18 = -2.0;
              uVar5 = 0xffffffff;
              for (uVar4 = 0; uVar4 != 3; uVar4 = uVar4 + 1) {
                dVar19 = *pdVar7 * normal[2] + pdVar7[-2] * normal[0] + pdVar7[-1] * normal[1];
                if (dVar19 <= -dVar19) {
                  dVar19 = -dVar19;
                }
                if (dVar18 < dVar19) {
                  uVar5 = uVar4 & 0xffffffff;
                  dVar18 = dVar19;
                }
                pdVar7 = pdVar7 + 3;
              }
              if ((int)uVar5 == -1) {
                pcVar14 = "first_i not set";
                uVar8 = 0x8f4;
LAB_0017e78f:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,uVar8,"ref_metric_closest_d",pcVar14);
                uVar5 = 1;
LAB_0017e816:
                pcVar14 = "closest";
                uVar8 = 0x938;
                goto LAB_0017e837;
              }
              pRVar16 = (REF_EDGE)0xbff0000000000000;
              uVar11 = 0xffffffff;
              for (uVar4 = 0; iVar9 = (int)uVar11, uVar4 != 3; uVar4 = uVar4 + 1) {
                if ((uVar5 != uVar4) &&
                   ((iVar9 == -1 || ((double)pRVar16 < (double)(&ref_edge)[uVar4])))) {
                  uVar11 = uVar4 & 0xffffffff;
                  pRVar16 = (&ref_edge)[uVar4];
                }
              }
              local_1b0 = lVar10;
              if (iVar9 == -1) {
                pcVar14 = "second_i not set";
                uVar8 = 0x8fe;
                goto LAB_0017e78f;
              }
              if (iVar9 == (int)uVar5) {
                pcVar14 = "first_i same as second_i";
                uVar8 = 0x8ff;
                goto LAB_0017e78f;
              }
              for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                local_258[lVar6 + 3] = normal[lVar6];
              }
              uVar3 = ref_math_normalize(local_258 + 3);
              if (uVar3 != 0) {
                uVar5 = (ulong)uVar3;
                pcVar14 = "first";
                uVar8 = 0x904;
LAB_0017e80c:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,uVar8,"ref_metric_closest_d",uVar5,pcVar14);
                goto LAB_0017e816;
              }
              for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
                local_258[lVar6 + 6] = (double)(&ref_edge)[iVar9 * 3 + 3 + (int)lVar6];
              }
              dVar17 = local_258[4] * local_228[1];
              dVar19 = local_258[3] * local_228[0];
              dVar18 = local_258[5] * local_228[2];
              for (lVar6 = 6; lVar6 != 9; lVar6 = lVar6 + 1) {
                local_258[lVar6] =
                     adStack_180[lVar6] * -(dVar18 + dVar19 + dVar17) + local_258[lVar6];
              }
              uVar3 = ref_math_normalize(local_258 + 6);
              if (uVar3 != 0) {
                uVar5 = (ulong)uVar3;
                pcVar14 = "second";
                uVar8 = 0x90e;
                goto LAB_0017e80c;
              }
              local_210 = local_228[2] * local_258[4] - local_258[5] * local_228[1];
              dStack_208 = local_228[0] * local_258[5] - local_258[3] * local_228[2];
              local_200 = local_258[3] * local_228[1] - local_228[0] * local_258[4];
              uVar3 = ref_math_normalize(local_258 + 9);
              if (uVar3 != 0) {
                uVar5 = (ulong)uVar3;
                pcVar14 = "third";
                uVar8 = 0x912;
                goto LAB_0017e80c;
              }
              dVar18 = (pRVar15[5] * local_258[5] +
                       pRVar15[2] * local_258[3] + local_258[4] * pRVar15[4]) * local_258[5] +
                       (pRVar15[2] * local_258[5] +
                       *pRVar15 * local_258[3] + pRVar15[1] * local_258[4]) * local_258[3] +
                       (pRVar15[4] * local_258[5] +
                       pRVar15[1] * local_258[3] + pRVar15[3] * local_258[4]) * local_258[4];
              if (dVar18 < 0.0) {
                dVar18 = sqrt(dVar18);
              }
              else {
                dVar18 = SQRT(dVar18);
              }
              local_258[0] = dVar18 * dVar18;
              dVar18 = (pRVar15[5] * local_228[2] +
                       pRVar15[2] * local_228[0] + local_228[1] * pRVar15[4]) * local_228[2] +
                       (pRVar15[2] * local_228[2] +
                       *pRVar15 * local_228[0] + pRVar15[1] * local_228[1]) * local_228[0] +
                       (pRVar15[4] * local_228[2] +
                       pRVar15[1] * local_228[0] + pRVar15[3] * local_228[1]) * local_228[1];
              if (dVar18 < 0.0) {
                dVar18 = sqrt(dVar18);
              }
              else {
                dVar18 = SQRT(dVar18);
              }
              local_258[1] = dVar18 * dVar18;
              dVar18 = (pRVar15[5] * local_200 + pRVar15[2] * local_210 + dStack_208 * pRVar15[4]) *
                       local_200 +
                       (pRVar15[2] * local_200 + *pRVar15 * local_210 + pRVar15[1] * dStack_208) *
                       local_210 +
                       (pRVar15[4] * local_200 + pRVar15[1] * local_210 + pRVar15[3] * dStack_208) *
                       dStack_208;
              if (dVar18 < 0.0) {
                dVar18 = sqrt(dVar18);
              }
              else {
                dVar18 = SQRT(dVar18);
              }
              metric = local_1f8;
              local_258[2] = dVar18 * dVar18;
              if (0.0 < local_1e0) {
                if (adStack_180[1] <= 1.0) {
                  pcVar14 = "eig 0";
                  uVar8 = 0x93b;
                  goto LAB_0017deee;
                }
                local_258[0] = local_1b8;
              }
              if (0.0 < local_1d8) {
                if (local_258[0] < 0.0) {
                  dVar18 = sqrt(local_258[0]);
                }
                else {
                  dVar18 = SQRT(local_258[0]);
                }
                if (local_258[0] < 0.0) {
                  local_1c8 = dVar18 * 1e+20;
                  dVar19 = sqrt(local_258[0]);
                  dVar18 = local_1c8;
                }
                else {
                  dVar19 = SQRT(local_258[0]);
                  dVar18 = dVar18 * 1e+20;
                }
                if (dVar19 * *(double *)(&DAT_0020cf60 + (ulong)(0.0 < dVar18) * 8) <= 1.0) {
                  pcVar14 = "eig 0";
                  uVar8 = 0x93f;
                  goto LAB_0017deee;
                }
                if (local_258[0] < 0.0) {
                  dVar18 = sqrt(local_258[0]);
                }
                else {
                  dVar18 = SQRT(local_258[0]);
                }
                dVar19 = 1.0 / dVar18;
                if (local_1d8 <= 1.0 / dVar18) {
                  dVar19 = local_1d8;
                }
                dVar18 = dVar19 * 1e+20 * dVar19;
                if (dVar18 <= -dVar18) {
                  dVar18 = -dVar18;
                }
                if (dVar18 <= 1.0) {
                  pcVar14 = "eig 0";
                  uVar8 = 0x942;
                  goto LAB_0017deee;
                }
                local_258[0] = 1.0 / (dVar19 * dVar19);
              }
              if ((1.0 < local_1e8) &&
                 (dVar18 = local_258[1] * local_1e8 * local_1e8, local_258[2] <= dVar18)) {
                local_258[2] = dVar18;
              }
              uVar3 = ref_matrix_form_m(local_258,m);
              if (uVar3 != 0) {
                uVar5 = (ulong)uVar3;
                pcVar14 = "form";
                uVar8 = 0x94b;
                goto LAB_0017e837;
              }
              uVar3 = ref_matrix_log_m(m,logm);
              if (uVar3 != 0) {
                uVar5 = (ulong)uVar3;
                pcVar14 = "form";
                uVar8 = 0x94c;
                goto LAB_0017e837;
              }
              for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
                vector_00[local_1a8 + lVar6] = logm[lVar6] + vector_00[local_1a8 + lVar6];
              }
              vector[local_1b0] = vector[local_1b0] + 1;
              ref_cell = local_1f0;
              lVar6 = local_1a0 + 1;
            }
          }
        }
        uVar3 = ref_node_ghost_dbl(ref_node,vector_00,6);
        if (uVar3 == 0) {
          uVar3 = ref_node_ghost_int(ref_node,vector,1);
          if (uVar3 == 0) {
            pRVar15 = vector_00;
            for (lVar6 = 0; lVar6 < ref_node->max; lVar6 = lVar6 + 1) {
              if ((-1 < ref_node->global[lVar6]) && (iVar12 = vector[lVar6], 0 < iVar12)) {
                for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
                  pRVar15[lVar10] = pRVar15[lVar10] / (double)iVar12;
                }
                vector[lVar6] = -1;
                uVar3 = ref_matrix_exp_m(vector_00 + lVar6 * 6,metric + lVar6 * 6);
                if (uVar3 != 0) {
                  uVar5 = (ulong)uVar3;
                  pcVar14 = "form";
                  uVar8 = 0x95f;
                  goto LAB_0017e837;
                }
              }
              pRVar15 = pRVar15 + 6;
            }
            uVar3 = ref_edge_create(&ref_edge,local_1d0);
            if (uVar3 == 0) {
              for (lVar6 = 0; lVar6 < ref_edge->n; lVar6 = lVar6 + 1) {
                iVar12 = ref_edge->e2n[lVar6 * 2];
                iVar9 = ref_edge->e2n[lVar6 * 2 + 1];
                iVar13 = vector[iVar12];
                if ((-1 < iVar13) && (vector[iVar9] == -1)) {
                  for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
                    vector_00[iVar12 * 6 + lVar10] =
                         vector_00[iVar9 * 6 + lVar10] + vector_00[iVar12 * 6 + lVar10];
                  }
                  iVar13 = iVar13 + 1;
                  vector[iVar12] = iVar13;
                }
                iVar1 = vector[iVar9];
                if ((-1 < iVar1) && (iVar13 == -1)) {
                  for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
                    vector_00[iVar9 * 6 + lVar10] =
                         vector_00[iVar12 * 6 + lVar10] + vector_00[iVar9 * 6 + lVar10];
                  }
                  vector[iVar9] = iVar1 + 1;
                }
              }
              ref_edge_free(ref_edge);
              uVar3 = ref_node_ghost_dbl(ref_node,vector_00,6);
              if (uVar3 == 0) {
                uVar3 = ref_node_ghost_int(ref_node,vector,1);
                if (uVar3 == 0) {
                  pRVar15 = vector_00;
                  for (lVar6 = 0; lVar6 < ref_node->max; lVar6 = lVar6 + 1) {
                    if ((-1 < ref_node->global[lVar6]) && (iVar12 = vector[lVar6], 0 < iVar12)) {
                      for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
                        pRVar15[lVar10] = pRVar15[lVar10] / (double)iVar12;
                      }
                      vector[lVar6] = -2;
                      uVar3 = ref_matrix_exp_m(vector_00 + lVar6 * 6,metric + lVar6 * 6);
                      if (uVar3 != 0) {
                        uVar5 = (ulong)uVar3;
                        pcVar14 = "form";
                        uVar8 = 0x984;
                        goto LAB_0017e837;
                      }
                    }
                    pRVar15 = pRVar15 + 6;
                  }
                  uVar3 = ref_node_ghost_dbl(ref_node,metric,6);
                  if (uVar3 == 0) {
                    free(vector_00);
                    free(vector);
                    return 0;
                  }
                  uVar5 = (ulong)uVar3;
                  pcVar14 = "ghost metric";
                  uVar8 = 0x988;
                }
                else {
                  uVar5 = (ulong)uVar3;
                  pcVar14 = "ghost hits";
                  uVar8 = 0x97b;
                }
              }
              else {
                uVar5 = (ulong)uVar3;
                pcVar14 = "ghost metric";
                uVar8 = 0x97a;
              }
            }
            else {
              uVar5 = (ulong)uVar3;
              pcVar14 = "orig edges";
              uVar8 = 0x966;
            }
          }
          else {
            uVar5 = (ulong)uVar3;
            pcVar14 = "ghost hits";
            uVar8 = 0x956;
          }
        }
        else {
          uVar5 = (ulong)uVar3;
          pcVar14 = "ghost metric";
          uVar8 = 0x955;
        }
LAB_0017e837:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar8,"ref_metric_faceid_spacing",uVar5,pcVar14);
        return (REF_STATUS)uVar5;
      }
      pcVar14 = "malloc new_log_metric of REF_DBL NULL";
      uVar8 = 0x92d;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar8,
           "ref_metric_faceid_spacing",pcVar14);
    RVar2 = 2;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_metric_faceid_spacing(REF_DBL *metric, REF_GRID ref_grid,
                                             REF_INT faceid,
                                             REF_DBL set_normal_spacing,
                                             REF_DBL ceil_normal_spacing,
                                             REF_DBL tangential_aspect_ratio) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL *new_log_metric;
  REF_INT *hits;
  REF_INT node;
  REF_INT i;
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  ref_malloc_init(new_log_metric, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (faceid == nodes[ref_cell_id_index(ref_cell)]) {
      REF_DBL normal[3];
      REF_INT cell_node;
      RSS(ref_node_tri_normal(ref_node, nodes, normal), "normal area");
      RSS(ref_math_normalize(normal), "normalize");
      each_ref_cell_cell_node(ref_cell, cell_node) {
        REF_DBL d[12], m[6], logm[6];
        REF_DBL h;
        node = nodes[cell_node];
        RSS(ref_metric_closest_d(normal, &(metric[6 * node]), d), "closest");
        if (set_normal_spacing > 0.0) {
          h = set_normal_spacing;
          RAS(ref_math_divisible(1.0, h * h), "eig 0");
          ref_matrix_eig(d, 0) = 1.0 / (h * h);
        }
        if (ceil_normal_spacing > 0.0) {
          RAS(ref_math_divisible(1.0, sqrt(ref_matrix_eig(d, 0))), "eig 0");
          h = 1.0 / sqrt(ref_matrix_eig(d, 0));
          h = MIN(h, ceil_normal_spacing);
          RAS(ref_math_divisible(1.0, h * h), "eig 0");
          ref_matrix_eig(d, 0) = 1.0 / (h * h);
        }
        if (tangential_aspect_ratio > 1.0) {
          ref_matrix_eig(d, 2) =
              MAX(ref_matrix_eig(d, 2), ref_matrix_eig(d, 1) *
                                            tangential_aspect_ratio *
                                            tangential_aspect_ratio);
        }
        RSS(ref_matrix_form_m(d, m), "form");
        RSS(ref_matrix_log_m(m, logm), "form");
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node] += logm[i];
        }
        hits[node] += 1;
      }
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -1;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  {
    REF_EDGE ref_edge;
    REF_INT edge, node0, node1;
    RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
    for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      if (0 <= hits[node0] && -1 == hits[node1]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node0] += new_log_metric[i + 6 * node1];
        }
        hits[node0] += 1;
      }
      if (0 <= hits[node1] && -1 == hits[node0]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node1] += new_log_metric[i + 6 * node0];
        }
        hits[node1] += 1;
      }
    }
    ref_edge_free(ref_edge);
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -2;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "ghost metric");

  ref_free(new_log_metric);
  ref_free(hits);
  return REF_SUCCESS;
}